

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftlib.c
# Opt level: O0

void iffts1(float *ioptr,long M,long Rows,float *Utbl,short *BRLow)

{
  long NDiffU_00;
  float *in_RCX;
  long in_RDX;
  float *in_RSI;
  float *in_RDI;
  long in_R8;
  float scale_00;
  long unaff_retaddr;
  float *in_stack_00000008;
  float scale;
  long NDiffU;
  long StageCnt;
  long in_stack_00000068;
  long in_stack_00000070;
  long in_stack_00000078;
  float *in_stack_00000080;
  long in_stack_00000088;
  float *in_stack_00000090;
  long StageCnt_00;
  
  scale_00 = (float)(double)(0x3ff0000000000000 - ((long)in_RSI << 0x34));
  switch(in_RSI) {
  case (float *)0x0:
    break;
  case (float *)0x1:
    for (; 0 < in_RDX; in_RDX = in_RDX + -1) {
      ifft2pt(in_RDI,scale_00);
      in_RDI = in_RDI + (1L << ((byte)in_RSI & 0x3f)) * 2;
    }
    break;
  case (float *)0x2:
    for (; 0 < in_RDX; in_RDX = in_RDX + -1) {
      ifft4pt(in_RDI,scale_00);
      in_RDI = in_RDI + (1L << ((byte)in_RSI & 0x3f)) * 2;
    }
    break;
  case (float *)0x3:
    for (; 0 < in_RDX; in_RDX = in_RDX + -1) {
      ifft8pt(in_RDI,scale_00);
      in_RDI = in_RDI + (1L << ((byte)in_RSI & 0x3f)) * 2;
    }
    break;
  default:
    for (; 0 < in_RDX; in_RDX = in_RDX + -1) {
      scbitrevR2(in_stack_00000008,unaff_retaddr,(short *)in_RDI,(float)((ulong)in_RSI >> 0x20));
      NDiffU_00 = ((long)in_RSI + -1) / 3;
      StageCnt_00 = 2;
      if ((long)in_RSI + NDiffU_00 * -3 + -1 == 1) {
        ibfR2(in_RCX,in_R8,NDiffU_00);
        StageCnt_00 = StageCnt_00 << 1;
      }
      if ((long)in_RSI + NDiffU_00 * -3 + -1 == 2) {
        ibfR4(in_RSI,in_RDX,(long)in_RCX);
        StageCnt_00 = StageCnt_00 << 2;
      }
      if (in_RSI < (float *)0xc) {
        ibfstages(in_stack_00000090,in_stack_00000088,in_stack_00000080,in_stack_00000078,
                  in_stack_00000070,in_stack_00000068);
      }
      else {
        ifftrecurs(in_RSI,in_RDX,in_RCX,in_R8,NDiffU_00,StageCnt_00);
      }
      in_RDI = in_RDI + (1L << ((byte)in_RSI & 0x3f)) * 2;
    }
  }
  return;
}

Assistant:

void iffts1(float *ioptr, long M, long Rows, float *Utbl, short *BRLow){
/* Compute in-place inverse complex fft on the rows of the input array	*/
/* INPUTS */
/* *ioptr = input data array	*/
/* M = log2 of fft size	*/
/* Rows = number of rows in ioptr array (use Rows of 1 if ioptr is a 1 dimensional array)	*/
/* *Utbl = cosine table	*/
/* *BRLow = bit reversed counter table	*/
/* OUTPUTS */
/* *ioptr = output data array	*/

long 	StageCnt;
long 	NDiffU;
const float scale = 1.0/POW2(M);

switch (M){
case 0:
	break;
case 1:
	for (;Rows>0;Rows--){
		ifft2pt(ioptr, scale);				/* a 2 pt fft */
		ioptr += 2*POW2(M);
	}
	break;
case 2:
	for (;Rows>0;Rows--){
		ifft4pt(ioptr, scale);				/* a 4 pt fft */
		ioptr += 2*POW2(M);
	}
	break;
case 3:
	for (;Rows>0;Rows--){
		ifft8pt(ioptr, scale);				/* an 8 pt fft */
		ioptr += 2*POW2(M);
	}
	break;
default:
	for (;Rows>0;Rows--){

		scbitrevR2(ioptr, M, BRLow, scale);	/* bit reverse and first radix 2 stage */
		
		StageCnt = (M-1) / 3;		// number of radix 8 stages
		NDiffU = 2;				// one radix 2 stage already complete

		if ( (M-1-(StageCnt * 3)) == 1 ){
			ibfR2(ioptr, M, NDiffU);				/* 1 radix 2 stage */
			NDiffU *= 2;
		}

		if ( (M-1-(StageCnt * 3)) == 2 ){
			ibfR4(ioptr, M, NDiffU);			/* 1 radix 4 stage */
			NDiffU *= 4;
		}

		if (M <= MCACHE)
			ibfstages(ioptr, M, Utbl, 1, NDiffU, StageCnt);		/*  RADIX 8 Stages	*/

		else{
			ifftrecurs(ioptr, M, Utbl, 1, NDiffU, StageCnt);		/*  RADIX 8 Stages	*/
		}

		ioptr += 2*POW2(M);
	}
}
}